

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variable.cpp
# Opt level: O0

void __thiscall Variable::Variable(Variable *this,string *variable_name,variable_type var_type)

{
  variable_type var_type_local;
  string *variable_name_local;
  Variable *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::operator=((string *)this,(string *)variable_name);
  this->type = var_type;
  return;
}

Assistant:

Variable::Variable(const string& variable_name, variable_type var_type)
{
	this->name = variable_name;
	this->type = var_type;
}